

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O0

MSize tab_len_slow(GCtab *t,size_t hi)

{
  uint uVar1;
  cTValue *pcVar2;
  bool bVar3;
  cTValue *local_68;
  cTValue *local_58;
  cTValue *local_48;
  cTValue *tvb;
  size_t mid;
  size_t lo;
  cTValue *tv;
  size_t hi_local;
  GCtab *t_local;
  
  tv = (cTValue *)(hi + 1);
  mid = hi;
  while( true ) {
    uVar1 = (uint)tv;
    if (uVar1 < t->asize) {
      local_48 = (cTValue *)((t->array).ptr64 + (long)(int)uVar1 * 8);
    }
    else {
      local_48 = lj_tab_getinth(t,uVar1);
    }
    bVar3 = false;
    if (local_48 != (cTValue *)0x0) {
      bVar3 = local_48->u64 != 0xffffffffffffffff;
    }
    pcVar2 = tv;
    if (!bVar3) break;
    mid = (size_t)tv;
    tv = (cTValue *)((long)tv * 2);
    if ((cTValue *)0x7ffffffd < tv) {
      mid = 1;
      while( true ) {
        uVar1 = (uint)mid;
        if (uVar1 < t->asize) {
          local_58 = (cTValue *)((t->array).ptr64 + (long)(int)uVar1 * 8);
        }
        else {
          local_58 = lj_tab_getinth(t,uVar1);
        }
        bVar3 = false;
        if (local_58 != (cTValue *)0x0) {
          bVar3 = local_58->u64 != 0xffffffffffffffff;
        }
        if (!bVar3) break;
        mid = mid + 1;
      }
      return uVar1 - 1;
    }
  }
  while (tv = pcVar2, 1 < (long)tv - mid) {
    pcVar2 = (cTValue *)(mid + (long)tv >> 1);
    uVar1 = (uint)pcVar2;
    if (uVar1 < t->asize) {
      local_68 = (cTValue *)((t->array).ptr64 + (long)(int)uVar1 * 8);
    }
    else {
      local_68 = lj_tab_getinth(t,uVar1);
    }
    if ((local_68 != (cTValue *)0x0) && (local_68->u64 != 0xffffffffffffffff)) {
      mid = (size_t)pcVar2;
      pcVar2 = tv;
    }
  }
  return (MSize)mid;
}

Assistant:

LJ_NOINLINE static MSize tab_len_slow(GCtab *t, size_t hi)
{
  cTValue *tv;
  size_t lo = hi;
  hi++;
  /* Widening search for an upper bound. */
  while ((tv = lj_tab_getint(t, (int32_t)hi)) && !tvisnil(tv)) {
    lo = hi;
    hi += hi;
    if (hi > (size_t)(INT_MAX-2)) {  /* Punt and do a linear search. */
      lo = 1;
      while ((tv = lj_tab_getint(t, (int32_t)lo)) && !tvisnil(tv)) lo++;
      return (MSize)(lo - 1);
    }
  }
  /* Binary search to find a non-nil to nil transition. */
  while (hi - lo > 1) {
    size_t mid = (lo+hi) >> 1;
    cTValue *tvb = lj_tab_getint(t, (int32_t)mid);
    if (tvb && !tvisnil(tvb)) lo = mid; else hi = mid;
  }
  return (MSize)lo;
}